

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::nativeEnterDirectory(QFileDialogPrivate *this,QUrl *directory)

{
  QFileDialog *this_00;
  char cVar1;
  Type *this_01;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *this_02;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QFileDialog::directoryUrlEntered(this_00,directory);
  this_02 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *)
            directory;
  cVar1 = QUrl::isEmpty();
  if (cVar1 == '\0') {
    this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
              operator()(this_02);
    QUrl::operator=(this_01,directory);
    cVar1 = QUrl::isLocalFile();
    if (cVar1 != '\0') {
      QUrl::toLocalFile();
      QFileDialog::directoryEntered(this_00,(QString *)&QStack_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::nativeEnterDirectory(const QUrl &directory)
{
    Q_Q(QFileDialog);
    emit q->directoryUrlEntered(directory);
    if (!directory.isEmpty()) { // Windows native dialogs occasionally emit signals with empty strings.
        *lastVisitedDir() = directory;
        if (directory.isLocalFile())
            emit q->directoryEntered(directory.toLocalFile());
    }
}